

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetRemoveOneFanout(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -1;
  lVar5 = 0;
  do {
    iVar1 = Vec_IntEntry(&p->pNtk->vRefs,iObj);
    if (iVar1 <= lVar5) {
      return iVar4;
    }
    piVar3 = Wln_RetFanouts(p,iObj);
    iVar1 = piVar3[lVar5 * 2];
    piVar3 = Wln_RetFanouts(p,iObj);
    piVar3 = Vec_IntEntryP(&p->vFanins,piVar3[lVar5 * 2 + 1]);
    if (piVar3 == (int *)0x0) {
      return iVar4;
    }
    if (iVar1 != 0) {
      if (*piVar3 == 0) {
        __assert_fail("pLink[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                      ,0x1bf,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
      }
      piVar3 = Wln_RetHeadToTail(p,piVar3);
      iVar1 = Vec_IntEntry(&p->vEdgeLinks,*piVar3 + 1);
      *piVar3 = 0;
      iVar2 = Wln_ObjIsFf(p->pNtk,iVar1);
      if (iVar2 == 0) {
        __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                      ,0x1c3,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
      }
      if (iVar4 == -1) {
        iVar4 = iVar1;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int Wln_RetRemoveOneFanout( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    //int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanout( p, iObj, iFanin, pLink, k )
    {
        assert( pLink[0] );
        pLink = Wln_RetHeadToTail( p, pLink );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pLink[0] = 0;
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}